

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,Options *options)

{
  pointer *pppFVar1;
  FieldDescriptor *descriptor_00;
  iterator __position;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __first;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __last;
  long lVar2;
  once_flag *__once;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  Descriptor *pDVar6;
  long lVar7;
  long lVar8;
  uint local_44;
  FieldDescriptor *local_40;
  FieldDescriptor *local_38;
  
  SourceGeneratorBase::SourceGeneratorBase(&this->super_SourceGeneratorBase,options);
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__MessageGenerator_004d17b0;
  this->descriptor_ = descriptor;
  (this->fields_by_number_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fields_by_number_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->fields_by_number_).
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->fields_by_number_).
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  uVar4 = GetGroupEndTag(descriptor);
  this->end_tag_ = uVar4;
  this->has_extension_ranges_ = 0 < *(int *)(descriptor + 0x78);
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 4)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      local_40 = (FieldDescriptor *)(*(long *)(pDVar6 + 0x28) + lVar7);
      __position._M_current =
           (this->fields_by_number_).
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->fields_by_number_).
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&this->fields_by_number_,__position,&local_40);
      }
      else {
        *__position._M_current = local_40;
        pppFVar1 = &(this->fields_by_number_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      lVar8 = lVar8 + 1;
      pDVar6 = this->descriptor_;
      lVar7 = lVar7 + 0x48;
    } while (lVar8 < *(int *)(pDVar6 + 4));
  }
  __first._M_current =
       (this->fields_by_number_).
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->fields_by_number_).
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar5 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
              (__first,__last,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
                )0x2be9d0);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*)>
                )0x2be9d0);
    pDVar6 = this->descriptor_;
  }
  if (0 < *(int *)(pDVar6 + 4)) {
    lVar7 = 0;
    lVar8 = 0;
    local_44 = 0;
    do {
      lVar2 = *(long *)(pDVar6 + 0x28);
      if ((~*(byte *)(lVar2 + 1 + lVar7) & 0x60) != 0) {
        descriptor_00 = (FieldDescriptor *)(lVar2 + lVar7);
        __once = *(once_flag **)(lVar2 + 0x18 + lVar7);
        if (__once != (once_flag *)0x0) {
          local_40 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
          local_38 = descriptor_00;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (__once,(_func_void_FieldDescriptor_ptr **)&local_40,&local_38);
        }
        if ((*(char *)(lVar2 + 2 + lVar7) != '\v') &&
           ((*(char *)(*(long *)(lVar2 + 0x10 + lVar7) + 0x3a) == '\x02' ||
            (((byte)descriptor_00[1] & 2) != 0)))) {
          bVar3 = IsNullable(descriptor_00);
          if (((!bVar3) && (((byte)descriptor_00[1] & 8) == 0)) &&
             (((((byte)descriptor_00[1] & 0x10) == 0 ||
               (lVar2 = *(long *)(lVar2 + 0x28 + lVar7), lVar2 == 0)) ||
              ((*(int *)(lVar2 + 4) == 1 && ((*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) != 0))))))
          {
            local_44 = local_44 + 1;
            if ((this->has_bit_field_count_ == 0) || ((local_44 & 0x1f) == 0)) {
              this->has_bit_field_count_ = this->has_bit_field_count_ + 1;
            }
          }
        }
      }
      lVar8 = lVar8 + 1;
      pDVar6 = this->descriptor_;
      lVar7 = lVar7 + 0x48;
    } while (lVar8 < *(int *)(pDVar6 + 4));
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const Descriptor* descriptor,
                                   const Options* options)
    : SourceGeneratorBase(options),
      descriptor_(descriptor),
      has_bit_field_count_(0),
      end_tag_(GetGroupEndTag(descriptor)),
      has_extension_ranges_(descriptor->extension_range_count() > 0) {
  // fields by number
  for (int i = 0; i < descriptor_->field_count(); i++) {
    fields_by_number_.push_back(descriptor_->field(i));
  }
  std::sort(fields_by_number_.begin(), fields_by_number_.end(),
            CompareFieldNumbers);

  int presence_bit_count = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (RequiresPresenceBit(field)) {
      presence_bit_count++;
      if (has_bit_field_count_ == 0 || (presence_bit_count % 32) == 0) {
        has_bit_field_count_++;
      }
    }
  }
}